

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag>
::sort(storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this)

{
  baryonyx *pbVar1;
  reference args;
  vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
  *this_00;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *this_01;
  char *in_R8;
  string_view fmt;
  string_view fmt_00;
  unsigned_long *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  int local_4c;
  undefined1 auStack_48 [4];
  int i;
  char *local_40;
  storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag> *local_38;
  int *local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  undefined1 local_20 [8];
  m_indices_writer lock;
  storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)local_20,&this->m_indices_mutex);
  local_28._M_current = (int *)std::begin<std::vector<int,std::allocator<int>>>(&this->m_indices);
  local_30 = (int *)std::end<std::vector<int,std::allocator<int>>>(&this->m_indices);
  local_38 = this;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>::sort()::_lambda(int,int)_1_>
            (local_28,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_30,
             (anon_class_8_1_8991fb9c)this);
  pbVar1 = _stdout;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,
             "- Solutions init population:\n");
  fmt._M_str = in_R8;
  fmt._M_len = (size_t)local_40;
  to_log<>(pbVar1,(FILE *)0x3,(uint)auStack_48,fmt);
  for (local_4c = 0; pbVar1 = _stdout, local_4c != this->m_size; local_4c = local_4c + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"- {} id {} value {} constraint {} hash {}\n");
    this_01 = &this->m_indices;
    args = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    this_00 = &this->m_data;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    pvVar3 = std::
             vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ::operator[](this_00,(long)*pvVar2);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    pvVar4 = std::
             vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ::operator[](this_00,(long)*pvVar2);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    pvVar5 = std::
             vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ::operator[](this_00,(long)*pvVar2);
    fmt_00._M_str = (char *)&local_4c;
    fmt_00._M_len = (size_t)local_60._M_str;
    to_log<int,int,double,int,unsigned_long>
              (pbVar1,(FILE *)0x5,(uint)local_60._M_len,fmt_00,args,(int *)&pvVar3->value,
               (double *)&pvVar4->remaining_constraints,(int *)&pvVar5->hash,
               in_stack_ffffffffffffff50);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_20);
  return;
}

Assistant:

void sort() noexcept
    {
        m_indices_writer lock{ m_indices_mutex };

        std::sort(
          std::begin(m_indices), std::end(m_indices), [this](int i1, int i2) {
              const int cst_1 = this->m_data[i1].remaining_constraints;
              const int cst_2 = this->m_data[i2].remaining_constraints;
              const double value_1 = this->m_data[i1].value;
              const double value_2 = this->m_data[i2].value;

              if (cst_1 < cst_2)
                  return true;

              if (cst_1 == cst_2)
                  return is_better_solution<Mode>(value_1, value_2);

              return false;
          });

#ifdef BARYONYX_ENABLE_DEBUG
        to_log(stdout, 3u, "- Solutions init population:\n");
        for (int i = 0; i != m_size; ++i) {
            to_log(stdout,
                   5u,
                   "- {} id {} value {} constraint {} hash {}\n",
                   i,
                   m_indices[i],
                   m_data[m_indices[i]].value,
                   m_data[m_indices[i]].remaining_constraints,
                   m_data[m_indices[i]].hash);
        }
#endif
    }